

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1531.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  fd_set *__exceptfds;
  fd_set *__writefds;
  fd_set *__readfds;
  timeval *__timeout;
  timeval tVar6;
  int maxfd;
  int still_running;
  undefined8 local_1e8;
  long curl_timeo;
  timeval timeout;
  timeval wait;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar3 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar3,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                  ,0x2c,iVar1,uVar2);
    goto LAB_001025dd;
  }
  uVar3 = curl_easy_init();
  uVar2 = curl_multi_init();
  curl_multi_add_handle(uVar2,uVar3);
  curl_easy_setopt(uVar3,0x2712,URL);
  curl_easy_setopt(uVar3,0x75a8,8);
  curl_easy_setopt(uVar3,0x271f,".abc");
  curl_multi_perform(uVar2,&still_running);
  tVar6 = tutil_tvnow();
  lVar4 = tutil_tvdiff(tVar6,tv_test_start);
  if (lVar4 < 0xea61) {
    local_1e8 = uVar3;
    do {
      maxfd = -1;
      curl_timeo = -1;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        (&msgs_left + lVar4 * 2)[0] = 0;
        (&msgs_left + lVar4 * 2)[1] = 0;
      }
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        fdwrite.__fds_bits[lVar4] = 0;
      }
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        fdexcep.__fds_bits[lVar4] = 0;
      }
      timeout.tv_sec = 1;
      timeout.tv_usec = 0;
      curl_multi_timeout(uVar2,&curl_timeo);
      if (-1 < curl_timeo) {
        timeout.tv_sec = (ulong)curl_timeo / 1000;
        if ((ulong)curl_timeo < 2000) {
          lVar4 = curl_timeo + -1000;
          if ((ulong)curl_timeo < 1000) {
            lVar4 = curl_timeo;
          }
          timeout.tv_usec = lVar4 * 1000;
        }
        else {
          timeout.tv_sec = 1;
        }
      }
      iVar1 = curl_multi_fdset(uVar2,(fd_set *)&msgs_left,&fdwrite,&fdexcep,&maxfd);
      if (iVar1 != 0) {
        curl_mfprintf(_stderr,"curl_multi_fdset() failed, code %d.\n",iVar1);
        break;
      }
      if (maxfd == -1) {
        wait.tv_sec = 0;
        wait.tv_usec = 100000;
        iVar1 = 0;
        __readfds = (fd_set *)0x0;
        __writefds = (fd_set *)0x0;
        __exceptfds = (fd_set *)0x0;
        __timeout = &wait;
      }
      else {
        iVar1 = maxfd + 1;
        __timeout = &timeout;
        __exceptfds = &fdexcep;
        __writefds = &fdwrite;
        __readfds = (fd_set *)&msgs_left;
      }
      iVar1 = select(iVar1,__readfds,(fd_set *)__writefds,(fd_set *)__exceptfds,(timeval *)__timeout
                    );
      if (iVar1 != -1) {
        curl_multi_perform(uVar2,&still_running);
      }
      tVar6 = tutil_tvnow();
      lVar4 = tutil_tvdiff(tVar6,tv_test_start);
      if (60000 < lVar4) {
        uVar3 = 0x87;
        goto LAB_001025a2;
      }
    } while (still_running != 0);
LAB_00102521:
    piVar5 = (int *)curl_multi_info_read(uVar2,&msgs_left);
    if ((piVar5 == (int *)0x0) || (*piVar5 != 1)) {
      tVar6 = tutil_tvnow();
      lVar4 = tutil_tvdiff(tVar6,tv_test_start);
      if (lVar4 < 0xea61) goto code_r0x0010255d;
      uVar3 = 0x92;
LAB_001025a2:
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                    ,uVar3);
      iVar1 = 0x7d;
      uVar3 = local_1e8;
    }
    else {
      iVar1 = 0;
      curl_mprintf("HTTP transfer completed with status %d\n",piVar5[4]);
      uVar3 = local_1e8;
    }
    goto LAB_001025c8;
  }
  curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                ,0x40);
  iVar1 = 0x7d;
  goto LAB_001025c8;
code_r0x0010255d:
  if (piVar5 == (int *)0x0) goto code_r0x00102562;
  goto LAB_00102521;
code_r0x00102562:
  iVar1 = 0;
  uVar3 = local_1e8;
LAB_001025c8:
  curl_multi_cleanup(uVar2);
  curl_easy_cleanup(uVar3);
  curl_global_cleanup();
LAB_001025dd:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *easy;
  CURLM *multi_handle;
  int still_running; /* keep number of running handles */
  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */
  int res = CURLE_OK;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  /* Allocate one CURL handle per transfer */
  easy = curl_easy_init();

  /* init a multi stack */
  multi_handle = curl_multi_init();

  /* add the individual transfer */
  curl_multi_add_handle(multi_handle, easy);

  /* set the options (I left out a few, you'll get the point anyway) */
  curl_easy_setopt(easy, CURLOPT_URL, URL);
  curl_easy_setopt(easy, CURLOPT_POSTFIELDSIZE_LARGE,
                   (curl_off_t)testDataSize);
  curl_easy_setopt(easy, CURLOPT_POSTFIELDS, testData);

  /* we start some action by calling perform right away */
  curl_multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  do {
    struct timeval timeout;
    int rc; /* select() return code */
    CURLMcode mc; /* curl_multi_fdset() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(multi_handle, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    mc = curl_multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    if(mc != CURLM_OK) {
      fprintf(stderr, "curl_multi_fdset() failed, code %d.\n", mc);
      break;
    }

    /* On success the value of maxfd is guaranteed to be >= -1. We call
       select(maxfd + 1, ...); specially in case of (maxfd == -1) there are
       no fds ready yet so we call select(0, ...) --or Sleep() on Windows--
       to sleep 100ms, which is the minimum suggested value in the
       curl_multi_fdset() doc. */

    if(maxfd == -1) {
#ifdef _WIN32
      Sleep(100);
      rc = 0;
#else
      /* Portable sleep for platforms other than Windows. */
      struct timeval wait = { 0, 100 * 1000 }; /* 100ms */
      rc = select(0, NULL, NULL, NULL, &wait);
#endif
    }
    else {
      /* Note that on some platforms 'timeout' may be modified by select().
         If you need access to the original value save a copy beforehand. */
      rc = select(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);
    }

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(multi_handle, &still_running);
      break;
    }

    abort_on_test_timeout();
  } while(still_running);

  /* See how the transfers went */
  do {
    msg = curl_multi_info_read(multi_handle, &msgs_left);
    if(msg && msg->msg == CURLMSG_DONE) {
      printf("HTTP transfer completed with status %d\n", msg->data.result);
      break;
    }

    abort_on_test_timeout();
  } while(msg);

test_cleanup:
  curl_multi_cleanup(multi_handle);

  /* Free the CURL handles */
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}